

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_large_dalloc_stats_update(tsdn_t *tsdn,arena_t *arena,size_t usize)

{
  bin_t *mutex;
  tsdn_t *in_RDX;
  long in_RSI;
  tsdn_t *in_RDI;
  szind_t hindex;
  bin_t *bin;
  szind_t index;
  szind_t ret;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint local_18;
  
  if (in_RDX < (tsdn_t *)0x1001) {
    local_18 = (uint)duckdb_je_sz_size2index_tab[(ulong)&(in_RDX->tsd).field_0x7 >> 3];
  }
  else {
    local_18 = sz_size2index_compute((size_t)in_RDI);
  }
  if (in_RDX < (tsdn_t *)0x4000) {
    mutex = arena_get_bin((arena_t *)CONCAT44(local_18,in_stack_ffffffffffffffc0),
                          (szind_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                          (uint)in_stack_ffffffffffffffb8);
    malloc_mutex_lock(in_RDX,(malloc_mutex_t *)CONCAT44(local_18,in_stack_ffffffffffffffc0));
    (mutex->stats).ndalloc = (mutex->stats).ndalloc + 1;
    malloc_mutex_unlock((tsdn_t *)CONCAT44(local_18,in_stack_ffffffffffffffc0),&mutex->lock);
  }
  else {
    locked_inc_u64(in_RDI,(malloc_mutex_t *)0x0,
                   (locked_u64_t *)(in_RSI + (ulong)(local_18 - 0x24) * 0x30 + 1000),1);
  }
  return;
}

Assistant:

static void
arena_large_dalloc_stats_update(tsdn_t *tsdn, arena_t *arena, size_t usize) {
	cassert(config_stats);

	szind_t index = sz_size2index(usize);
	/* This only occurs when we have a sampled small allocation */
	if (usize < SC_LARGE_MINCLASS) {
		assert(index < SC_NBINS);
		assert(usize >= PAGE && usize % PAGE == 0);
		bin_t *bin = arena_get_bin(arena, index, /* binshard */ 0);
		malloc_mutex_lock(tsdn, &bin->lock);
		bin->stats.ndalloc++;
		malloc_mutex_unlock(tsdn, &bin->lock);
	} else {
		assert(index >= SC_NBINS);
		szind_t hindex = index - SC_NBINS;
		LOCKEDINT_MTX_LOCK(tsdn, arena->stats.mtx);
		locked_inc_u64(tsdn, LOCKEDINT_MTX(arena->stats.mtx),
			&arena->stats.lstats[hindex].ndalloc, 1);
		LOCKEDINT_MTX_UNLOCK(tsdn, arena->stats.mtx);
	}
}